

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

xmlCharEncError xmlIconvConvert(void *vctxt,uchar *out,int *outlen,uchar *in,int *inlen,int flush)

{
  size_t sVar1;
  int *piVar2;
  size_t ret;
  char *icv_out;
  char *icv_in;
  size_t icv_outlen;
  size_t icv_inlen;
  xmlIconvCtxt *ctxt;
  int *piStack_38;
  int flush_local;
  int *inlen_local;
  uchar *in_local;
  int *outlen_local;
  uchar *out_local;
  void *vctxt_local;
  
  if ((((out == (uchar *)0x0) || (outlen == (int *)0x0)) || (inlen == (int *)0x0)) ||
     (in == (uchar *)0x0)) {
    if (outlen != (int *)0x0) {
      *outlen = 0;
    }
    vctxt_local._4_4_ = XML_ENC_ERR_INTERNAL;
  }
  else {
    icv_outlen = (size_t)*inlen;
    icv_in = (char *)(long)*outlen;
    ret = (size_t)out;
    icv_out = (char *)in;
    icv_inlen = (size_t)vctxt;
    ctxt._4_4_ = flush;
    piStack_38 = inlen;
    inlen_local = (int *)in;
    in_local = (uchar *)outlen;
    outlen_local = (int *)out;
    out_local = (uchar *)vctxt;
    sVar1 = iconv(*vctxt,&icv_out,&icv_outlen,(char **)&ret,(size_t *)&icv_in);
    *piStack_38 = *piStack_38 - (int)icv_outlen;
    *(int *)in_local = *(int *)in_local - (int)icv_in;
    if (sVar1 == 0xffffffffffffffff) {
      piVar2 = __errno_location();
      if (*piVar2 == 0x54) {
        vctxt_local._4_4_ = XML_ENC_ERR_INPUT;
      }
      else {
        piVar2 = __errno_location();
        if (*piVar2 == 7) {
          vctxt_local._4_4_ = XML_ENC_ERR_SPACE;
        }
        else {
          piVar2 = __errno_location();
          if (*piVar2 == 0x16) {
            vctxt_local._4_4_ = XML_ENC_ERR_SUCCESS;
          }
          else {
            vctxt_local._4_4_ = XML_ENC_ERR_INTERNAL;
          }
        }
      }
    }
    else {
      vctxt_local._4_4_ = XML_ENC_ERR_SUCCESS;
    }
  }
  return vctxt_local._4_4_;
}

Assistant:

static xmlCharEncError
xmlIconvConvert(void *vctxt, unsigned char *out, int *outlen,
                const unsigned char *in, int *inlen,
                int flush ATTRIBUTE_UNUSED) {
    xmlIconvCtxt *ctxt = vctxt;
    size_t icv_inlen, icv_outlen;
    const char *icv_in = (const char *) in;
    char *icv_out = (char *) out;
    size_t ret;

    if ((out == NULL) || (outlen == NULL) || (inlen == NULL) || (in == NULL)) {
        if (outlen != NULL) *outlen = 0;
        return(XML_ENC_ERR_INTERNAL);
    }
    icv_inlen = *inlen;
    icv_outlen = *outlen;
    /*
     * Some versions take const, other versions take non-const input.
     */
    ret = iconv(ctxt->cd, (void *) &icv_in, &icv_inlen, &icv_out, &icv_outlen);
    *inlen -= icv_inlen;
    *outlen -= icv_outlen;
    if (ret == (size_t) -1) {
        if (errno == EILSEQ)
            return(XML_ENC_ERR_INPUT);
        if (errno == E2BIG)
            return(XML_ENC_ERR_SPACE);
        /*
         * EINVAL means a truncated multi-byte sequence at the end
         * of the input buffer. We treat this as success.
         */
        if (errno == EINVAL)
            return(XML_ENC_ERR_SUCCESS);
#ifdef __APPLE__
        /*
         * Apple's new libiconv can return EOPNOTSUPP under
         * unknown circumstances (detected when fuzzing).
         */
        if (errno == EOPNOTSUPP)
            return(XML_ENC_ERR_INPUT);
#endif
        return(XML_ENC_ERR_INTERNAL);
    }
    return(XML_ENC_ERR_SUCCESS);
}